

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  invalid_argument *piVar2;
  ostream *poVar3;
  size_type sVar4;
  long in_RSI;
  int in_EDI;
  string *in_stack_00000070;
  exception *e;
  char *libraryVersion;
  int i;
  bool verbose;
  Compression compression;
  char *outFile;
  vector<const_char_*,_std::allocator<const_char_*>_> inFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  views;
  undefined1 in_stack_0000043b;
  Compression in_stack_0000043c;
  char *in_stack_00000440;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_00000448;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000450;
  value_type *in_stack_fffffffffffffe98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffea0;
  value_type *in_stack_fffffffffffffea8;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_fffffffffffffeb0;
  allocator<char> *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  undefined8 in_stack_ffffffffffffff00;
  undefined1 verbose_00;
  char *in_stack_ffffffffffffff08;
  ostream *in_stack_ffffffffffffff10;
  allocator<char> local_b9;
  string local_b8 [32];
  char *local_98;
  allocator<char> local_89;
  string local_88 [36];
  int local_64;
  undefined4 local_60;
  undefined1 local_4d;
  Compression local_4c;
  long local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1075be);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)0x1075cb);
  local_48 = 0;
  local_4c = PIZ_COMPRESSION;
  local_4d = 0;
  if (local_8 < 2) {
    anon_unknown.dwarf_cf85::usageMessage
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               SUB81((ulong)in_stack_ffffffffffffff00 >> 0x38,0));
    local_4 = -1;
  }
  else {
    local_64 = 1;
    while (local_64 < local_8) {
      iVar1 = strcmp(*(char **)(local_10 + (long)local_64 * 8),"-z");
      if (iVar1 == 0) {
        if (local_8 + -2 < local_64) {
          piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar2,"Missing compression value with -z option")
          ;
          __cxa_throw(piVar2,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
        local_4c = anon_unknown.dwarf_cf85::getCompression(in_stack_00000070);
        std::__cxx11::string::~string(local_88);
        std::allocator<char>::~allocator(&local_89);
        local_64 = local_64 + 2;
      }
      else {
        iVar1 = strcmp(*(char **)(local_10 + (long)local_64 * 8),"-v");
        if (iVar1 == 0) {
          local_4d = 1;
          local_64 = local_64 + 1;
        }
        else {
          iVar1 = strcmp(*(char **)(local_10 + (long)local_64 * 8),"-h");
          verbose_00 = (undefined1)((ulong)in_stack_ffffffffffffff00 >> 0x38);
          if (iVar1 == 0) {
LAB_001078a4:
            anon_unknown.dwarf_cf85::usageMessage
                      (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,(bool)verbose_00);
            local_4 = 0;
            goto LAB_00107e25;
          }
          iVar1 = strcmp(*(char **)(local_10 + (long)local_64 * 8),"--help");
          verbose_00 = (undefined1)((ulong)in_stack_ffffffffffffff00 >> 0x38);
          if (iVar1 == 0) goto LAB_001078a4;
          iVar1 = strcmp(*(char **)(local_10 + (long)local_64 * 8),"--version");
          if (iVar1 == 0) {
            local_98 = (char *)Imf_3_4::getLibraryVersion();
            poVar3 = std::operator<<((ostream *)&std::cout,"exrmultiview (OpenEXR) ");
            std::operator<<(poVar3,"3.4.0");
            iVar1 = strcmp(local_98,"3.4.0");
            if (iVar1 != 0) {
              poVar3 = std::operator<<((ostream *)&std::cout,"(OpenEXR version ");
              poVar3 = std::operator<<(poVar3,local_98);
              std::operator<<(poVar3,")");
            }
            poVar3 = std::operator<<((ostream *)&std::cout," https://openexr.com");
            std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
            poVar3 = std::operator<<((ostream *)&std::cout,
                                     "Copyright (c) Contributors to the OpenEXR Project");
            std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
            poVar3 = std::operator<<((ostream *)&std::cout,"License BSD-3-Clause");
            std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
            local_4 = 0;
            goto LAB_00107e25;
          }
          if ((local_8 + -2 < local_64) || (**(char **)(local_10 + (long)(local_64 + 1) * 8) == '-')
             ) {
            if (local_48 != 0) {
              piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument(piVar2,"improper output file specified");
              __cxa_throw(piVar2,&std::invalid_argument::typeinfo,
                          std::invalid_argument::~invalid_argument);
            }
            local_48 = *(long *)(local_10 + (long)local_64 * 8);
            local_64 = local_64 + 1;
          }
          else {
            in_stack_fffffffffffffed0 = &local_b9;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0
                      );
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
            std::__cxx11::string::~string(local_b8);
            std::allocator<char>::~allocator(&local_b9);
            std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                      (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
            local_64 = local_64 + 2;
          }
        }
      }
    }
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_28);
    if (sVar4 < 2) {
      piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar2,"Must specify at least two views");
      __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    if (local_48 == 0) {
      piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar2,"Must specify an output file");
      __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    makeMultiView(in_stack_00000450,in_stack_00000448,in_stack_00000440,in_stack_0000043c,
                  (bool)in_stack_0000043b);
    local_4 = 0;
  }
LAB_00107e25:
  local_60 = 1;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector(in_stack_fffffffffffffeb0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffeb0);
  return local_4;
}

Assistant:

int
main (int argc, char** argv)
{
    vector<string>      views;
    vector<const char*> inFiles;
    const char*         outFile     = 0;
    Compression         compression = PIZ_COMPRESSION;
    bool                verbose     = false;

    //
    // Parse the command line.
    //

    if (argc < 2)
    {
        usageMessage (cerr, argv[0], false);
        return -1;
    }

    try
    {

        int i = 1;

        while (i < argc)
        {
            if (!strcmp (argv[i], "-z"))
            {
                //
                // Set compression method
                //

                if (i > argc - 2)
                    throw invalid_argument (
                        "Missing compression value with -z option");

                compression = getCompression (argv[i + 1]);
                i += 2;
            }
            else if (!strcmp (argv[i], "-v"))
            {
                //
                // Verbose mode
                //

                verbose = true;
                i += 1;
            }
            else if (!strcmp (argv[i], "-h") || !strcmp (argv[i], "--help"))
            {
                //
                // Print help message
                //

                usageMessage (cout, "exrmultiview", true);
                return 0;
            }
            else if (!strcmp (argv[i], "--version"))
            {
                const char* libraryVersion = getLibraryVersion ();

                cout << "exrmultiview (OpenEXR) " << OPENEXR_VERSION_STRING;
                if (strcmp (libraryVersion, OPENEXR_VERSION_STRING))
                    cout << "(OpenEXR version " << libraryVersion << ")";
                cout << " https://openexr.com" << endl;
                cout << "Copyright (c) Contributors to the OpenEXR Project"
                     << endl;
                cout << "License BSD-3-Clause" << endl;
                return 0;
            }
            else
            {
                //
                // View or image file name
                //

                if (i > argc - 2 || argv[i + 1][0] == '-')
                {
                    //
                    // Output file
                    //

                    if (outFile)
                        throw invalid_argument (
                            "improper output file specified");

                    outFile = argv[i];
                    i += 1;
                }
                else
                {
                    //
                    // View plus input file
                    //

                    views.push_back (argv[i]);
                    inFiles.push_back (argv[i + 1]);
                    i += 2;
                }
            }
        }

        if (views.size () < 2)
            throw invalid_argument ("Must specify at least two views");

        if (outFile == 0)
            throw invalid_argument ("Must specify an output file");

        //
        // Load inFiles, and save a combined multi-view image in outFile.
        //

        makeMultiView (views, inFiles, outFile, compression, verbose);
    }
    catch (const exception& e)
    {
        cerr << argv[0] << ": " << e.what () << endl;
        return -1;
    }

    return 0;
}